

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

bool __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,bool b)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    bVar4 = false;
    MADPComponentDiscreteActions::SetInitialized(&this->_m_A,false);
    MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,false);
    MADPComponentFactoredStates::SetInitialized(&this->_m_S,false);
    bVar2 = true;
  }
  else {
    bVar1 = MADPComponentDiscreteActions::SetInitialized(&this->_m_A,true);
    bVar4 = false;
    bVar2 = false;
    if (bVar1) {
      bVar1 = MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,true);
      bVar4 = false;
      bVar2 = false;
      if (bVar1) {
        bVar1 = MADPComponentFactoredStates::SetInitialized(&this->_m_S,true);
        bVar4 = false;
        bVar2 = false;
        if (bVar1) {
          cVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x60))(this);
          if (cVar3 != '\0') {
            cVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x68))(this);
            bVar4 = true;
            bVar2 = true;
            if (cVar3 != '\0') goto LAB_00483ec6;
          }
          bVar4 = false;
          bVar2 = false;
        }
      }
    }
  }
LAB_00483ec6:
  this->_m_initialized = bVar4;
  return bVar2;
}

Assistant:

bool MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(     !_m_A.SetInitialized(b)
            ||  !_m_O.SetInitialized(b)
            ||  !_m_S.SetInitialized(b) )
        {
            //error in initialization of sub-components.
            _m_initialized = false;
            return(false);
        }
        ////check if transition- and observation model are present...
        //if(_m_p_tModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");
        //}
        //if(_m_p_oModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");

        //}

        if( SanityCheck() )
        {
            _m_initialized = true;
            return(true);
        }
        else
        {
            _m_initialized = false;
            return(false);
        }
    }
    else
    {
        _m_A.SetInitialized(b);
        _m_O.SetInitialized(b);
        _m_S.SetInitialized(b); 
        _m_initialized = false;
        return(true);
    }

}